

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  value_type window_00;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((window->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((window->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  this = &pIVar1->CurrentWindowStack;
  ImVector<ImGuiWindow_*>::pop_back(this);
  if ((window->Flags & 0x4000000) != 0) {
    ImVector<ImGuiPopupRef>::pop_back(&pIVar1->CurrentPopupStack);
  }
  window_00 = (ImGuiWindow *)0x0;
  CheckStacksSize(window,false);
  if (this->Size != 0) {
    ppIVar2 = ImVector<ImGuiWindow_*>::back(this);
    window_00 = *ppIVar2;
  }
  SetCurrentWindow(window_00);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}